

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O1

lh_table *
lh_table_new(int size,lh_entry_free_fn *free_fn,lh_hash_fn *hash_fn,lh_equal_fn *equal_fn)

{
  lh_table *__ptr;
  lh_entry *plVar1;
  long lVar2;
  
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/linkhash.c",
                  0x1fa,
                  "struct lh_table *lh_table_new(int, lh_entry_free_fn *, lh_hash_fn *, lh_equal_fn *)"
                 );
  }
  __ptr = (lh_table *)calloc(1,0x38);
  if (__ptr != (lh_table *)0x0) {
    __ptr->count = 0;
    __ptr->size = size;
    plVar1 = (lh_entry *)calloc((ulong)(uint)size,0x28);
    __ptr->table = plVar1;
    if (plVar1 != (lh_entry *)0x0) {
      __ptr->free_fn = free_fn;
      __ptr->hash_fn = hash_fn;
      __ptr->equal_fn = equal_fn;
      lVar2 = 0;
      do {
        *(undefined8 *)((long)&plVar1->k + lVar2) = 0xffffffffffffffff;
        lVar2 = lVar2 + 0x28;
      } while ((ulong)(uint)size * 0x28 != lVar2);
      return __ptr;
    }
    free(__ptr);
  }
  return (lh_table *)0x0;
}

Assistant:

struct lh_table *lh_table_new(int size, lh_entry_free_fn *free_fn, lh_hash_fn *hash_fn,
                              lh_equal_fn *equal_fn)
{
	int i;
	struct lh_table *t;

	/* Allocate space for elements to avoid divisions by zero. */
	assert(size > 0);
	t = (struct lh_table *)calloc(1, sizeof(struct lh_table));
	if (!t)
		return NULL;

	t->count = 0;
	t->size = size;
	t->table = (struct lh_entry *)calloc(size, sizeof(struct lh_entry));
	if (!t->table)
	{
		free(t);
		return NULL;
	}
	t->free_fn = free_fn;
	t->hash_fn = hash_fn;
	t->equal_fn = equal_fn;
	for (i = 0; i < size; i++)
		t->table[i].k = LH_EMPTY;
	return t;
}